

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

string * pad_or_truncate_password_V4(string *__return_storage_ptr__,string *password)

{
  ulong __n;
  char k1 [32];
  
  __n = password->_M_string_length;
  if (0x1f < password->_M_string_length) {
    __n = 0x20;
  }
  memcpy(k1,(password->_M_dataplus)._M_p,__n);
  memcpy(k1 + __n,padding_string,0x20 - __n);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,k1,&stack0xffffffffffffffd8);
  return __return_storage_ptr__;
}

Assistant:

static std::string
pad_or_truncate_password_V4(std::string const& password)
{
    char k1[key_bytes];
    pad_or_truncate_password_V4(password, k1);
    return {k1, key_bytes};
}